

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

bool pbrt::upgradeRGBToScale(ParameterDictionary *dict,char *name,Float *totalScale)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Allocator alloc;
  bool bVar2;
  optional<pbrt::RGB> rgb;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> s;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  float local_48;
  char local_44;
  vector<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,name,(allocator<char> *)local_50);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  ParameterDictionary::GetSpectrumArray(&local_40,dict,&local_70,Unbounded,alloc);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
    ParameterDictionary::GetOneRGB((ParameterDictionary *)local_50,(string *)dict);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_44 == '\x01') {
      bVar2 = false;
      if ((float)local_50._0_4_ == (float)local_50._4_4_) {
        bVar2 = false;
        if (((float)local_50._4_4_ == local_48) && (!NAN((float)local_50._4_4_) && !NAN(local_48)))
        {
          *totalScale = (float)local_50._0_4_ * *totalScale;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,name,&local_71);
          ParameterDictionary::RemoveSpectrum(dict,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != paVar1) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          bVar2 = true;
        }
      }
    }
    else {
      bVar2 = false;
    }
  }
  if ((ParsedParameter *)
      local_40.super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (ParsedParameter *)0x0) {
    operator_delete(local_40.
                    super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.
                          super__Vector_base<pbrt::SpectrumHandle,_std::allocator<pbrt::SpectrumHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar2;
}

Assistant:

static bool upgradeRGBToScale(ParameterDictionary *dict, const char *name,
                              Float *totalScale) {
    std::vector<SpectrumHandle> s =
        dict->GetSpectrumArray(name, SpectrumType::Unbounded, {});
    if (s.empty())
        return true;

    pstd::optional<RGB> rgb = dict->GetOneRGB(name);
    if (!rgb || rgb->r != rgb->g || rgb->g != rgb->b)
        return false;

    *totalScale *= rgb->r;
    dict->RemoveSpectrum(name);
    return true;
}